

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

void anon_unknown.dwarf_2bc2::parseComponents(ndicapi *api,char *data)

{
  unsigned_short *puVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  char (*pacVar11) [20];
  uint i;
  short *psVar12;
  unsigned_short *puVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  short sVar17;
  
  api->Bx2GBFVersion = *(unsigned_short *)data;
  sVar3 = *(short *)(data + 2);
  psVar12 = (short *)(data + 4);
  for (sVar17 = 0; sVar17 != sVar3; sVar17 = sVar17 + 1) {
    sVar4 = *psVar12;
    puVar1 = (unsigned_short *)(psVar12 + 6);
    iVar6 = *(int *)(psVar12 + 1);
    uVar7 = *(uint *)(psVar12 + 4);
    if (sVar4 == 0x12) {
      api->Bx2SystemAlertsCount = uVar7;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        api->Bx2SystemAlerts[uVar9][0] = puVar1[uVar9 * 2];
        api->Bx2SystemAlerts[uVar9][1] = psVar12[uVar9 * 2 + 7];
      }
    }
    else if (sVar4 == 2) {
      uVar9 = (ulong)uVar7;
      if (0x17 < uVar7) {
        uVar9 = 0x18;
      }
      api->Bx2HandleCount = (uint)uVar9;
      pfVar10 = api->Bx2Transforms[0] + 7;
      puVar13 = puVar1;
      for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
        api->Bx2Handles[uVar14] = *puVar13;
        bVar2 = *(byte *)((long)puVar13 + 3);
        api->Bx2HandlesStatus[uVar14] = puVar13[1];
        if ((bVar2 & 2) != 0) {
          api->Bx2HandleAveragingEnabled[uVar14] = true;
        }
        if ((bVar2 & 1) == 0) {
          (*(float (*) [8])(pfVar10 + -7))[0] = *(float *)(puVar13 + 2);
          pfVar10[-6] = *(float *)(puVar13 + 4);
          pfVar10[-5] = *(float *)(puVar13 + 6);
          pfVar10[-4] = *(float *)(puVar13 + 8);
          pfVar10[-3] = *(float *)(puVar13 + 10);
          pfVar10[-2] = *(float *)(puVar13 + 0xc);
          pfVar10[-1] = *(float *)(puVar13 + 0xe);
          *pfVar10 = *(float *)(puVar13 + 0x10);
          puVar13 = puVar13 + 0x12;
        }
        else {
          puVar13 = puVar13 + 2;
        }
        pfVar10 = pfVar10 + 8;
      }
    }
    else if (sVar4 == 3) {
      uVar9 = (ulong)uVar7;
      if (0x17 < uVar7) {
        uVar9 = 0x18;
      }
      pacVar11 = api->Bx2_3DMarkerStatus;
      pfVar10 = api->Bx2_3DMarkerPosition[0][0] + 2;
      puVar13 = puVar1;
      for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
        uVar5 = puVar13[1];
        puVar13 = puVar13 + 2;
        pfVar15 = pfVar10;
        for (uVar16 = 0; uVar5 != uVar16; uVar16 = uVar16 + 1) {
          (*pacVar11)[uVar16] = (char)*puVar13;
          (*(float (*) [3])(pfVar15 + -2))[0] = *(float *)(puVar13 + 2);
          pfVar15[-1] = *(float *)(puVar13 + 4);
          *pfVar15 = *(float *)(puVar13 + 6);
          pfVar15 = pfVar15 + 3;
          puVar13 = puVar13 + 8;
        }
        pfVar10 = pfVar10 + 0x3c;
        pacVar11 = pacVar11 + 1;
      }
    }
    else if (sVar4 == 1) {
      api->Bx2FrameType = (uchar)psVar12[6];
      api->Bx2FrameSequenceIndex = *(uchar *)((long)psVar12 + 0xd);
      api->Bx2FrameNumber = *(uint *)(psVar12 + 8);
      psVar12 = psVar12 + 10;
      for (lVar8 = 0x48a0; lVar8 != 0x4898; lVar8 = lVar8 + -1) {
        *(char *)((long)&api->SerialDevice + lVar8) = (char)*psVar12;
        psVar12 = (short *)((long)psVar12 + 1);
      }
      parseComponents(api,(char *)psVar12);
    }
    psVar12 = (short *)((long)puVar1 + (ulong)(iVar6 - 0xc));
  }
  return;
}

Assistant:

void parseComponents(ndicapi* api, const char* data)
  {
    const char* componentIndex = data;

    // GBF version
    api->Bx2GBFVersion = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;
    // GBF Component count
    unsigned short componentCount = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
    componentIndex += 2;

    unsigned int totalSkipLength(0);
    for (unsigned short i = 0; i < componentCount; ++i)
    {
      // Component
      unsigned short componentType = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int componentSize = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;
      unsigned short itemOption = (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 2;
      unsigned int itemCount = (unsigned char)componentIndex[3] << 24 | (unsigned char)componentIndex[2] << 16 | (unsigned char)componentIndex[1] << 8 | (unsigned char)componentIndex[0];
      componentIndex += 4;

      switch (componentType)
      {
      case NDI_COMPONENTID_FRAME:
        parseFrameComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_6D:
        parse6DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D:
        parse3DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_1D:
        parse1DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_2D:
        parse2DComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_LINE_SEP:
        parseLineSepComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_3D_ERROR:
        parse3DErrorComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_IMAGE:
        parse1DImageComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_UV:
        parseUVComponent(api, componentIndex, itemOption, itemCount);
        break;
      case NDI_COMPONENTID_SYS_ALERT:
        parseSystemAlertComponent(api, componentIndex, itemOption, itemCount);
        break;
      default:
        // Unknown component type, do nothing
        break;
      }

      componentIndex += componentSize - 12; // skip component size - header size
    }
  }